

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Writer::~BP5Writer(BP5Writer *this)

{
  byte bVar1;
  undefined8 in_RDX;
  BP5Engine *in_RDI;
  vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  *unaff_retaddr;
  
  *(undefined ***)in_RDI = &PTR__BP5Writer_0112fb50;
  if (((byte)(in_RDI->m_MetadataIndex).m_Buffer.super__Vector_base<char,_std::allocator<char>_>.
             _M_impl.super__Tp_alloc_type & 1) != 0) {
    bVar1 = (in_RDI->m_MetadataIndex).m_Buffer.super__Vector_base<char,_std::allocator<char>_>.
            _M_impl.field_0x1;
    (**(code **)(*(long *)in_RDI + 0x428))
              (in_RDI,bVar1 & 1,in_RDX,CONCAT71(0x112fb,bVar1) & 0xffffffffffffff01);
  }
  (in_RDI->m_MetadataIndex).m_Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Tp_alloc_type = (_Tp_alloc_type)0x0;
  shm::Spinlock::~Spinlock((Spinlock *)&in_RDI[7].m_Parameters);
  std::
  vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ::~vector(unaff_retaddr);
  std::future<int>::~future((future<int> *)0xa8f14e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr);
  profiling::JSONProfiler::~JSONProfiler((JSONProfiler *)0xa8f1a3);
  helper::Comm::~Comm((Comm *)0xa8f1b4);
  aggregator::MPIChain::~MPIChain((MPIChain *)0xa8f1c5);
  helper::Comm::~Comm((Comm *)0xa8f1d6);
  aggregator::MPIChain::~MPIChain((MPIChain *)0xa8f1e7);
  aggregator::MPIShmChain::~MPIShmChain((MPIShmChain *)in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  std::__cxx11::string::~string((string *)in_RDI[4].m_Parameters.UUID.field_2._M_local_buf);
  burstbuffer::FileDrainerSingleThread::~FileDrainerSingleThread((FileDrainerSingleThread *)in_RDI);
  transportman::TransportMan::~TransportMan((TransportMan *)0xa8f2b3);
  transportman::TransportMan::~TransportMan((TransportMan *)0xa8f2c4);
  transportman::TransportMan::~TransportMan((TransportMan *)0xa8f2d5);
  transportman::TransportMan::~TransportMan((TransportMan *)0xa8f2e6);
  adios2::format::BP5Serializer::~BP5Serializer((BP5Serializer *)0xa8f2f7);
  Engine::~Engine((Engine *)in_RDI);
  BP5Engine::~BP5Engine(in_RDI);
  return;
}

Assistant:

BP5Writer::~BP5Writer()
{
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}